

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss.h
# Opt level: O1

void gimage::gauss<float>
               (Image<float,_gimage::PixelTraits<float>_> *target,
               Image<float,_gimage::PixelTraits<float>_> *image,float s)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long i;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  GaussKernel kernel;
  ImageFloat tmp;
  GaussKernel local_c8;
  Image<float,_gimage::PixelTraits<float>_> *local_b8;
  float ***local_b0;
  long local_a8;
  float *local_a0;
  long local_98;
  Image<float,_gimage::PixelTraits<float>_> *local_90;
  float *local_88;
  float ***local_80;
  long local_78;
  float **local_70;
  Image<float,_gimage::PixelTraits<float>_> local_68;
  
  local_c8.kernel = (float *)0x0;
  local_c8.kn = 0;
  local_c8.kn2 = 0;
  GaussKernel::set(&local_c8,s);
  local_68.depth = 0;
  local_68.width = 0;
  local_68.height = 0;
  local_68.n = 0;
  local_68.pixel = (float *)0x0;
  local_68.row = (float **)0x0;
  local_68.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_68,image->height,1,1);
  pfVar1 = **local_68.img;
  local_b8 = target;
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (target,image->width,image->height,(long)image->depth);
  local_78 = (long)image->depth;
  if (0 < local_78) {
    local_80 = local_b8->img;
    lVar2 = image->width;
    lVar3 = image->height;
    lVar7 = 0;
    do {
      local_70 = local_80[lVar7];
      local_a0 = *local_70;
      if (0 < lVar3) {
        local_98 = lVar2 - local_c8.kn2;
        local_a8 = -(ulong)(uint)local_c8.kn2;
        lVar13 = 0;
        pfVar4 = local_a0;
        do {
          if (0 < lVar2) {
            local_b0 = image->img;
            lVar8 = 0;
            lVar5 = local_a8;
            do {
              if (lVar8 < local_98 && local_c8.kn2 <= lVar8) {
                if (local_c8.kn < 1) {
                  fVar14 = 0.0;
                }
                else {
                  fVar14 = 0.0;
                  lVar9 = 0;
                  do {
                    fVar14 = fVar14 + local_c8.kernel[lVar9] *
                                      local_b0[lVar7][lVar13][(int)lVar5 + lVar9];
                    lVar9 = lVar9 + 1;
                  } while (local_c8.kn != lVar9);
                }
              }
              else {
                fVar14 = NAN;
                if (0 < local_c8.kn) {
                  fVar15 = 0.0;
                  lVar9 = 0;
                  fVar14 = 0.0;
                  do {
                    uVar11 = (int)lVar5 + (int)lVar9;
                    if ((-1 < (int)uVar11) &&
                       (uVar12 = (ulong)(uVar11 & 0x7fffffff), (long)uVar12 < lVar2)) {
                      fVar15 = fVar15 + local_c8.kernel[lVar9];
                      fVar14 = fVar14 + local_c8.kernel[lVar9] * image->img[lVar7][lVar13][uVar12];
                    }
                    lVar9 = lVar9 + 1;
                  } while (local_c8.kn != lVar9);
                  fVar14 = fVar14 / fVar15;
                }
              }
              *pfVar4 = fVar14;
              pfVar4 = pfVar4 + 1;
              lVar8 = lVar8 + 1;
              lVar5 = lVar5 + 1;
            } while (lVar8 != lVar2);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar3);
      }
      if (0 < lVar2) {
        local_b0 = (float ***)(long)local_c8.kn2;
        lVar13 = local_b8->width;
        local_a8 = -(ulong)(uint)local_c8.kn2;
        local_98 = lVar13 * 4;
        lVar5 = 0;
        do {
          if (0 < lVar3) {
            lVar8 = local_b8->height;
            lVar6 = 0;
            lVar9 = local_a8;
            do {
              if ((lVar6 < (long)local_b0) || (lVar8 - (long)local_b0 <= lVar6)) {
                fVar14 = NAN;
                if (0 < local_c8.kn) {
                  fVar15 = 0.0;
                  lVar10 = 0;
                  fVar14 = 0.0;
                  do {
                    uVar11 = (int)lVar9 + (int)lVar10;
                    if ((-1 < (int)uVar11) &&
                       (uVar12 = (ulong)(uVar11 & 0x7fffffff), (long)uVar12 < local_b8->height)) {
                      fVar15 = fVar15 + local_c8.kernel[lVar10];
                      fVar14 = fVar14 + local_c8.kernel[lVar10] *
                                        local_b8->img[lVar7][uVar12][lVar5];
                    }
                    lVar10 = lVar10 + 1;
                  } while (local_c8.kn != lVar10);
                  fVar14 = fVar14 / fVar15;
                }
              }
              else if (local_c8.kn < 1) {
                fVar14 = 0.0;
              }
              else {
                fVar14 = 0.0;
                lVar10 = 0;
                do {
                  fVar14 = fVar14 + local_c8.kernel[lVar10] * local_70[(int)lVar9 + lVar10][lVar5];
                  lVar10 = lVar10 + 1;
                } while (local_c8.kn != lVar10);
              }
              pfVar1[lVar6] = fVar14;
              lVar6 = lVar6 + 1;
              lVar9 = lVar9 + 1;
            } while (lVar6 != lVar3);
          }
          if (0 < lVar3) {
            lVar8 = 0;
            pfVar4 = local_a0;
            do {
              *pfVar4 = pfVar1[lVar8];
              lVar8 = lVar8 + 1;
              pfVar4 = pfVar4 + lVar13;
            } while (lVar3 != lVar8);
          }
          lVar5 = lVar5 + 1;
          local_a0 = local_a0 + 1;
        } while (lVar5 != lVar2);
      }
      lVar7 = lVar7 + 1;
      local_88 = pfVar1;
    } while (lVar7 != local_78);
  }
  local_90 = image;
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_68);
  if (local_c8.kernel != (float *)0x0) {
    operator_delete__(local_c8.kernel);
  }
  return;
}

Assistant:

void gauss(Image<T> &target, const Image<T> &image, float s)
{
  GaussKernel kernel(s);

  ImageFloat tmp(image.getHeight(), 1, 1);
  float *p=tmp.getPtr(0, 0, 0);

  target.setSize(image.getWidth(), image.getHeight(), image.getDepth());

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal into target image

    T *tp=target.getPtr(0, 0, d);
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        *tp++=static_cast<T>(kernel.convolveHorizontal(image, i, k, d));
      }
    }

    // convolve vertically in place

    for (long i=0; i<image.getWidth(); i++)
    {
      for (long k=0; k<image.getHeight(); k++)
      {
        p[k]=kernel.convolveVertical(target, i, k, d);
      }

      tp=target.getPtr(i, 0, d);
      for (long k=0; k<image.getHeight(); k++)
      {
        *tp=static_cast<T>(p[k]);
        tp+=target.getWidth();
      }
    }
  }
}